

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IEnumerableCore.hpp
# Opt level: O2

IEnumerableCore<linq::ExceptState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:137:13),_int>_>
* __thiscall
linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>::
Except<linq::IEnumerable<int>>
          (IEnumerableCore<linq::ExceptState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:137:13),_int>_>
           *__return_storage_ptr__,
          IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>
          *this,IEnumerable<int> *other)

{
  anon_class_1_0_00000001_for_transformer f;
  anon_class_1_0_00000001_for_transformer local_a9;
  ExceptState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:137:13),_int>
  local_a8;
  
  ExceptState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:137:13),_int>
  ::ExceptState(&local_a8,(ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int> *)this,
                other,&local_a9);
  ExceptState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:137:13),_int>
  ::ExceptState(&__return_storage_ptr__->source,&local_a8);
  ExceptState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:137:13),_int>
  ::~ExceptState(&local_a8);
  return __return_storage_ptr__;
}

Assistant:

auto Except(O&& other)
		{
			using S2 = typename std::remove_reference<O>::type;
			using TS = typename std::remove_reference<T>::type;
			auto f = [](TS x) { return x; };
			using F = decltype(f);
			return IEnumerableCore<ExceptState<S, S2, F, TS>>(ExceptState<S, S2, F, TS>(std::move(source), std::move(other), f));
		}